

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_lightning_bolt(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  CClass *pCVar4;
  ulong uVar5;
  float local_2c;
  
  uVar2 = 0x32;
  if (level < 0x32) {
    uVar2 = level;
  }
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  iVar3 = number_range((int)spell_lightning_bolt::dam_each[uVar5] / 2,
                       spell_lightning_bolt::dam_each[uVar5] * 2);
  pCVar4 = ch->my_class;
  if ((pCVar4 == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (pCVar4 = ch->pIndexData->my_class, pCVar4 == (CClass *)0x0)))) {
    pCVar4 = CClass::GetClass(0);
  }
  local_2c = (float)iVar3;
  bVar1 = RString::operator==(&pCVar4->name,"sorcerer");
  if (bVar1) {
    act("You extend an arm towards $N and raw lightning leaps from your fingertips!",ch,(void *)0x0,
        vo,3);
    act("$n extends an arm towards you and raw lightning leaps from $s fingertips!",ch,(void *)0x0,
        vo,2);
    act("$n extends an arm towards $N and raw lightning leaps from $s fingertips!",ch,(void *)0x0,vo
        ,1);
    local_2c = local_2c * 1.5;
  }
  bVar1 = saves_spell((int)uVar5,(CHAR_DATA *)vo,6);
  if (bVar1) {
    local_2c = local_2c * 0.5;
  }
  damage_old(ch,(CHAR_DATA *)vo,(int)local_2c,sn,6,true);
  return;
}

Assistant:

void spell_lightning_bolt(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	static const short dam_each[] =
	{
		0,  0,  0,  0,  0,  0,  0,  0,  0,  25, 28, 31, 34, 37, 40, 40, 41,
		42, 42, 43, 44, 44, 45, 46, 46, 47, 48, 48, 49, 50, 50, 51, 52, 52,
		53, 54, 54, 55, 56, 56, 57, 58, 58, 59, 60, 60, 61, 62, 62, 63, 64
	}
	;
	float dam;

	level = std::min(level, (int)sizeof(dam_each) / (int)sizeof(dam_each[0]) - 1);
	level = std::max(0, level);
	dam = number_range(dam_each[level] / 2, dam_each[level] * 2);

	if (ch->Class()->name == "sorcerer")
	{
		act("You extend an arm towards $N and raw lightning leaps from your fingertips!", ch, nullptr, victim, TO_CHAR);
		act("$n extends an arm towards you and raw lightning leaps from $s fingertips!", ch, nullptr, victim, TO_VICT);
		act("$n extends an arm towards $N and raw lightning leaps from $s fingertips!", ch, nullptr, victim, TO_NOTVICT);
		dam *= 1.5;
	}

	if (saves_spell(level, victim, DAM_LIGHTNING))
		dam /= 2;

	damage_old(ch, victim, (int)dam, sn, DAM_LIGHTNING, true);
}